

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

mecab_learner_node_t * __thiscall
MeCab::FreeList<mecab_learner_node_t>::alloc(FreeList<mecab_learner_node_t> *this)

{
  value_type pmVar1;
  long lVar2;
  undefined1 auVar3 [16];
  vector<mecab_learner_node_t_*,_std::allocator<mecab_learner_node_t_*>_> *pvVar4;
  ulong uVar5;
  reference ppmVar6;
  value_type *__x;
  long in_RDI;
  vector<mecab_learner_node_t_*,_std::allocator<mecab_learner_node_t_*>_> *this_00;
  
  if (*(long *)(in_RDI + 0x20) == *(long *)(in_RDI + 0x30)) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  this_00 = *(vector<mecab_learner_node_t_*,_std::allocator<mecab_learner_node_t_*>_> **)
             (in_RDI + 0x28);
  pvVar4 = (vector<mecab_learner_node_t_*,_std::allocator<mecab_learner_node_t_*>_> *)
           std::vector<mecab_learner_node_t_*,_std::allocator<mecab_learner_node_t_*>_>::size
                     ((vector<mecab_learner_node_t_*,_std::allocator<mecab_learner_node_t_*>_> *)
                      (in_RDI + 8));
  if (this_00 == pvVar4) {
    __x = (value_type *)(in_RDI + 8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(in_RDI + 0x30);
    uVar5 = SUB168(auVar3 * ZEXT816(0x98),0);
    if (SUB168(auVar3 * ZEXT816(0x98),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    operator_new__(uVar5);
    std::vector<mecab_learner_node_t_*,_std::allocator<mecab_learner_node_t_*>_>::push_back
              (this_00,__x);
  }
  ppmVar6 = std::vector<mecab_learner_node_t_*,_std::allocator<mecab_learner_node_t_*>_>::operator[]
                      ((vector<mecab_learner_node_t_*,_std::allocator<mecab_learner_node_t_*>_> *)
                       (in_RDI + 8),*(size_type *)(in_RDI + 0x28));
  pmVar1 = *ppmVar6;
  lVar2 = *(long *)(in_RDI + 0x20);
  *(long *)(in_RDI + 0x20) = lVar2 + 1;
  return pmVar1 + lVar2;
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }